

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O2

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadSubMeshNames(OgreBinarySerializer *this,Mesh *mesh)

{
  uint16_t uVar1;
  SubMesh *s;
  Logger *this_00;
  ostream *poVar2;
  DeadlyImportError *this_01;
  ulong uVar3;
  string *this_02;
  string local_1c8;
  string local_1a8 [11];
  
  if (*(int *)&this->m_reader->end != *(int *)&this->m_reader->current) {
    uVar1 = ReadHeader(this,true);
    while( true ) {
      uVar3 = (long)this->m_reader->end - (long)this->m_reader->current;
      if ((uVar1 != 0xa100) || ((uVar3 & 0xffffffff) == 0)) break;
      uVar1 = Read<unsigned_short>(this);
      s = Ogre::Mesh::GetSubMesh(mesh,(ulong)uVar1);
      if (s == (SubMesh *)0x0) {
        this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::operator<<((ostream *)local_1a8,"Ogre Mesh does not include submesh ");
        std::ostream::operator<<(local_1a8,uVar1);
        std::operator<<((ostream *)local_1a8,
                        " referenced in M_SUBMESH_NAME_TABLE_ELEMENT. Invalid mesh file.");
        std::__cxx11::stringbuf::str();
        DeadlyImportError::DeadlyImportError(this_01,&local_1c8);
        __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      ReadLine_abi_cxx11_(local_1a8,this);
      this_02 = &(s->super_ISubMesh).name;
      std::__cxx11::string::operator=((string *)this_02,(string *)local_1a8);
      std::__cxx11::string::~string((string *)local_1a8);
      this_00 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[13]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                 (char (*) [13])"  - SubMesh ");
      poVar2 = (ostream *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                         local_1a8,(uint *)s);
      std::operator<<(poVar2," name \'");
      std::operator<<(poVar2,(string *)this_02);
      std::operator<<(poVar2,"\'");
      std::__cxx11::stringbuf::str();
      Logger::debug(this_00,local_1c8._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      uVar1 = 0xa100;
      if (*(int *)&this->m_reader->end != *(int *)&this->m_reader->current) {
        uVar1 = ReadHeader(this,true);
      }
    }
    if ((int)uVar3 != 0) {
      RollbackHeader(this);
    }
  }
  return;
}

Assistant:

void OgreBinarySerializer::ReadSubMeshNames(Mesh *mesh)
{
    uint16_t id = 0;

    if (!AtEnd())
    {
        id = ReadHeader();
        while (!AtEnd() && id == M_SUBMESH_NAME_TABLE_ELEMENT)
        {
            uint16_t submeshIndex = Read<uint16_t>();
            SubMesh *submesh = mesh->GetSubMesh(submeshIndex);
            if (!submesh) {
                throw DeadlyImportError(Formatter::format() << "Ogre Mesh does not include submesh " << submeshIndex << " referenced in M_SUBMESH_NAME_TABLE_ELEMENT. Invalid mesh file.");
            }

            submesh->name = ReadLine();
            ASSIMP_LOG_DEBUG_F( "  - SubMesh ", submesh->index, " name '", submesh->name, "'");

            if (!AtEnd())
                id = ReadHeader();
        }
        if (!AtEnd())
            RollbackHeader();
    }
}